

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O1

double __thiscall COLLADABU::Math::Quaternion::exp(Quaternion *this,double __x)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long in_RSI;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  Real RVar9;
  
  dVar2 = *(double *)(in_RSI + 0x18) * *(double *)(in_RSI + 0x18) +
          *(double *)(in_RSI + 8) * *(double *)(in_RSI + 8) +
          *(double *)(in_RSI + 0x10) * *(double *)(in_RSI + 0x10);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar8 = sin(dVar2);
  this->w = 1.0;
  this->x = 0.0;
  this->y = 0.0;
  this->z = 0.0;
  dVar3 = cos(dVar2);
  this->w = dVar3;
  if (0.001 <= ABS(dVar8)) {
    dVar8 = dVar8 / dVar2;
    auVar1 = *(undefined1 (*) [16])(in_RSI + 8);
    uVar6 = auVar1._0_4_;
    uVar7 = auVar1._4_4_;
    this->x = dVar8 * auVar1._0_8_;
    this->y = dVar8 * auVar1._8_8_;
    RVar9 = dVar8 * *(double *)(in_RSI + 0x18);
  }
  else {
    uVar6 = *(undefined4 *)(in_RSI + 8);
    uVar7 = *(undefined4 *)(in_RSI + 0xc);
    uVar4 = *(undefined4 *)(in_RSI + 0x10);
    uVar5 = *(undefined4 *)(in_RSI + 0x14);
    *(undefined4 *)&this->x = uVar6;
    *(undefined4 *)((long)&this->x + 4) = uVar7;
    *(undefined4 *)&this->y = uVar4;
    *(undefined4 *)((long)&this->y + 4) = uVar5;
    RVar9 = *(Real *)(in_RSI + 0x18);
  }
  this->z = RVar9;
  return (double)CONCAT44(uVar7,uVar6);
}

Assistant:

Quaternion Quaternion::exp () const
        {
            // If q = A*(x*i+y*j+z*k) where (x,y,z) is unit length, then
            // exp(q) = cos(A)+sin(A)*(x*i+y*j+z*k).  If sin(A) is near zero,
            // use exp(q) = cos(A)+A*(x*i+y*j+z*k) since A/sin(A) has limit 1.

            Real fAngle_radian = sqrt( x * x + y * y + z * z );
            Real fSin = sin( fAngle_radian );

            Quaternion kResult;
            kResult.w = cos( fAngle_radian );

            if ( std::abs( fSin ) >= ms_fEpsilon )
            {
                Real fCoeff = fSin / fAngle_radian;
                kResult.x = fCoeff * x;
                kResult.y = fCoeff * y;
                kResult.z = fCoeff * z;
            }

            else
            {
                kResult.x = x;
                kResult.y = y;
                kResult.z = z;
            }

            return kResult;
        }